

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall Js::CompoundString::BlockInfo::CopyFrom(BlockInfo *this,Block *block)

{
  Block *pBVar1;
  
  pBVar1 = (block->bufferOwner).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->buffer).ptr = pBVar1 + 1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  this->charLength = block->charLength;
  this->charCapacity = block->charCapacity;
  return;
}

Assistant:

void CompoundString::BlockInfo::CopyFrom(Block *const block)
    {
        buffer = block->Buffer();
        charLength = block->CharLength();
        charCapacity = block->CharCapacity();
    }